

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O3

int CheckOpponent(Situation *situation)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  ushort uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  iVar5 = situation->current_player;
  iVar12 = iVar5 * 0x10;
  uVar1 = iVar12 + 0x10;
  bVar2 = situation->current_pieces[iVar5 * -0x10 + 0x20];
  uVar8 = (ulong)bVar2;
  bVar4 = bVar2 >> 4;
  uVar9 = bVar2 & 0xf;
  lVar10 = (long)(int)uVar1;
  iVar7 = iVar12 + 0x15;
  lVar11 = lVar10;
  do {
    bVar3 = situation->current_pieces[lVar11 + 5];
    if (bVar3 != 0) {
      if ((HORSE_LEGAL_MOVE[(bVar2 + 0x100) - (uint)bVar3] != 0) &&
         (situation->current_board
          [(int)(HORSE_LEGAL_MOVE[(bVar2 + 0x100) - (uint)bVar3] + (uint)bVar3)] == '\0')) {
        return iVar7;
      }
    }
    iVar7 = iVar7 + 1;
    lVar13 = lVar11 + 5;
    lVar11 = lVar11 + 1;
  } while (lVar13 < iVar12 + 0x16);
  iVar7 = iVar12 + 0x17;
  lVar11 = lVar10;
  do {
    bVar3 = situation->current_pieces[lVar11 + 7];
    if (bVar3 != 0) {
      if ((bVar3 & 0xf) == uVar9) {
        uVar6 = *(ushort *)
                 ((ulong)(bVar3 >> 4) * 0x2000 + 0x328d52 + (ulong)situation->bit_col[uVar9] * 8) &
                BIT_COL_MASK[uVar8];
      }
      else {
        if (bVar3 >> 4 != bVar4) goto LAB_00108d36;
        uVar6 = *(ushort *)
                 ((ulong)((bVar3 & 0xf) << 0xc) + 0x322d52 + (ulong)situation->bit_row[bVar4] * 8) &
                BIT_ROW_MASK[uVar8];
      }
      if (uVar6 != 0) {
        return iVar7;
      }
    }
LAB_00108d36:
    iVar7 = iVar7 + 1;
    lVar13 = lVar11 + 7;
    lVar11 = lVar11 + 1;
  } while (lVar13 < iVar12 + 0x18);
  iVar7 = iVar12 + 0x19;
  do {
    bVar3 = situation->current_pieces[lVar10 + 9];
    if (bVar3 != 0) {
      if ((bVar3 & 0xf) == uVar9) {
        uVar6 = *(ushort *)
                 ((ulong)(bVar3 >> 4) * 0x2000 + 0x328d54 + (ulong)situation->bit_col[uVar9] * 8) &
                BIT_COL_MASK[uVar8];
      }
      else {
        if (bVar3 >> 4 != bVar4) goto LAB_00108dd3;
        uVar6 = *(ushort *)
                 ((ulong)((bVar3 & 0xf) << 0xc) + 0x322d54 + (ulong)situation->bit_row[bVar4] * 8) &
                BIT_ROW_MASK[uVar8];
      }
      if (uVar6 != 0) {
        return iVar7;
      }
    }
LAB_00108dd3:
    iVar7 = iVar7 + 1;
    lVar11 = lVar10 + 9;
    lVar10 = lVar10 + 1;
    if (iVar12 + 0x1a <= lVar11) {
      bVar4 = situation->current_board[(int)((uint)bVar2 + iVar5 * -0x20 + 0x10)];
      uVar9 = (uint)bVar4;
      if (((uVar1 & bVar4) == 0) || ((bVar4 & 0xf) < 0xb)) {
        lVar10 = uVar8 - 3;
        do {
          bVar4 = situation->current_board[lVar10 + 2];
          if (((uVar1 & bVar4) != 0) && (10 < (bVar4 & 0xf))) {
            return (uint)bVar4;
          }
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)(ulong)bVar2);
        uVar9 = 0;
      }
      return uVar9;
    }
  } while( true );
}

Assistant:

int CheckOpponent(const Situation & situation){
    // 1. 获得玩家特征值
    int player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int from, to, from_row, from_col, to_row, to_col;

    // 1. 判断对方将(帅)是否在棋盘上，并记录其位置
    to = situation.current_pieces[GetPlayerFlag(OpponentPlayer(situation.current_player)) + 0];
    // if(to == 0) return 1;
    to_row = GetRow(to);
    to_col = GetCol(to);

    // 2. 检测马的将军
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
            if(horse_leg != from && situation.current_board[horse_leg] == 0) return i;
        }
    }

    // 3. 检测车的将军
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            from_row = GetRow(from);
            from_col = GetCol(from);
            if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0) 
                    return i;
            }
            else if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0) 
                    return i;
            }
        }
    }
    
    // 4. 检测炮的将军
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            from_row = GetRow(from);
            from_col = GetCol(from);
            if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0) 
                    return i;
            }
            else if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0) 
                    return i;
            }
        }
    }

    // 5. 检测兵(卒)的将军(纵向)
    from = SquareBack(to, player);
    int from_id = situation.current_board[from];
    if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11))
        return from_id;

    // 6. 检测兵(卒)的将军(横向)
    for(from = to - 1; from <= to + 1; from += 2){
        int from_id = situation.current_board[from];
        if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11))
            return from_id;
    }

    // 7. 没有被将军
    return 0;
}